

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Int_t * Gia_ManDetectHalfAdders(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iLit0;
  int iLit0_00;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  int iLit1;
  long lVar13;
  ulong uVar14;
  int Counts [5];
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  uint local_7c;
  uint local_68;
  uint local_58 [6];
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  Gia_ManHashStart(p);
  if (p->nXors == 0) {
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Gia_ManCreateRefs(p);
    if (0 < p->nObjs) {
      lVar9 = 0;
      lVar13 = 0;
      do {
        pGVar1 = p->pObjs;
        if (pGVar1 == (Gia_Obj_t *)0x0) break;
        pObj = (Gia_Obj_t *)(&pGVar1->field_0x0 + lVar9);
        if (((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) &&
           (iVar5 = Gia_ObjRecognizeExor(pObj,&local_38,&local_40), iVar5 != 0)) {
          uVar10 = *(undefined8 *)pObj;
          uVar12 = (uint)uVar10 & 0x1fffffff;
          piVar6 = p->pRefs;
          bVar3 = 1 < *(int *)((long)piVar6 + (lVar13 * 4 - (ulong)(uVar12 * 4)));
          iVar5 = (int)lVar13;
          if (bVar3) {
            Vec_IntPush(p_00,iVar5);
            Vec_IntPush(p_00,iVar5 - uVar12);
            uVar10 = *(undefined8 *)pObj;
            piVar6 = p->pRefs;
          }
          local_7c = (uint)bVar3;
          uVar12 = (uint)((ulong)uVar10 >> 0x20) & 0x1fffffff;
          if (1 < *(int *)((long)piVar6 + (lVar13 * 4 - (ulong)(uVar12 * 4)))) {
            Vec_IntPush(p_00,iVar5);
            Vec_IntPush(p_00,iVar5 - uVar12);
            local_7c = local_7c + 1;
          }
          pGVar2 = p->pObjs;
          if ((((local_38 < pGVar2) || (pGVar2 + p->nObjs <= local_38)) || (local_40 < pGVar2)) ||
             (pGVar2 + p->nObjs <= local_40)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar14 = *(ulong *)((long)pObj +
                             (ulong)(((uint)*(ulong *)(&pGVar1->field_0x0 + lVar9) & 0x1fffffff) <<
                                    2) * -3);
          uVar11 = (uint)(uVar14 >> 0x1d) & 1;
          uVar12 = (uint)(uVar14 >> 0x3d) & 1;
          uVar14 = *(ulong *)((long)pObj +
                             (ulong)((uint)(*(ulong *)(&pGVar1->field_0x0 + lVar9) >> 0x1e) &
                                    0x7ffffffc) * -3);
          if ((uVar11 ^ uVar12) != (((uint)(uVar14 >> 0x3d) ^ (uint)(uVar14 >> 0x1d) & 7) & 1)) {
            __assert_fail("fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj)))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x5c,"Vec_Int_t *Gia_ManDetectHalfAdders(Gia_Man_t *, int)");
          }
          iVar8 = (int)((ulong)((long)local_38 - (long)pGVar2) >> 2);
          iVar7 = (int)((ulong)((long)local_40 - (long)pGVar2) >> 2);
          if (uVar11 == uVar12) {
            if ((iVar8 * -0x55555555 < 0) || (iVar7 * -0x55555555 < 0)) goto LAB_00672594;
            uVar12 = Gia_ManHashLookupInt(p,iVar8 * 0x55555556,iVar7 * 0x55555556 + 1);
            if (uVar12 != 0) {
              if ((int)uVar12 < 0) goto LAB_006725b3;
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar12 >> 1);
              local_7c = local_7c + 1;
            }
            uVar12 = iVar7 * 0x55555556;
          }
          else {
            if ((iVar8 * -0x55555555 < 0) || (iVar7 * -0x55555555 < 0)) goto LAB_00672594;
            uVar12 = Gia_ManHashLookupInt(p,iVar8 * 0x55555556,iVar7 * 0x55555556);
            if (uVar12 != 0) {
              if ((int)uVar12 < 0) goto LAB_006725b3;
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar12 >> 1);
              local_7c = local_7c + 1;
            }
            uVar12 = iVar7 * 0x55555556 | 1;
          }
          uVar12 = Gia_ManHashLookupInt(p,iVar8 * 0x55555556 | 1,uVar12);
          if (uVar12 != 0) {
            if ((int)uVar12 < 0) goto LAB_006725b3;
            Vec_IntPush(p_00,iVar5);
            Vec_IntPush(p_00,uVar12 >> 1);
            local_7c = local_7c + 1;
          }
          local_58[local_7c] = local_58[local_7c] + 1;
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar9 + 0xc;
      } while (lVar13 < p->nObjs);
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
  }
  else {
    iVar5 = p->nObjs;
    if (0 < iVar5) {
      iVar8 = 1;
      lVar9 = 0;
      lVar13 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar10 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar9);
        uVar12 = (uint)uVar10;
        if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
          uVar12 = uVar12 & 0x1fffffff;
          uVar11 = (uint)((ulong)uVar10 >> 0x20) & 0x1fffffff;
          if (uVar12 < uVar11) {
            iVar5 = (int)lVar13;
            if (((int)(iVar5 - uVar12) < 0) || ((int)(iVar5 - uVar11) < 0)) {
LAB_00672594:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            iLit0 = ~(uVar12 * 2) + iVar8;
            iVar7 = ~(uVar11 * 2) + iVar8;
            uVar4 = Gia_ManHashLookupInt(p,iLit0,iVar7);
            if (uVar4 == 0) {
              local_68 = 0;
            }
            else {
              if ((int)uVar4 < 0) {
LAB_006725b3:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar4 >> 1);
              local_68 = 1;
            }
            iLit0_00 = iVar8 + uVar12 * -2;
            iLit1 = iVar8 + uVar11 * -2;
            uVar12 = Gia_ManHashLookupInt(p,iLit0_00,iLit1);
            if (uVar12 != 0) {
              if ((int)uVar12 < 0) goto LAB_006725b3;
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar12 >> 1);
              local_68 = local_68 + 1;
            }
            uVar12 = Gia_ManHashLookupInt(p,iLit0,iLit1);
            if (uVar12 != 0) {
              if ((int)uVar12 < 0) goto LAB_006725b3;
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar12 >> 1);
              local_68 = local_68 + 1;
            }
            uVar12 = Gia_ManHashLookupInt(p,iLit0_00,iVar7);
            if (uVar12 != 0) {
              if ((int)uVar12 < 0) goto LAB_006725b3;
              Vec_IntPush(p_00,iVar5);
              Vec_IntPush(p_00,uVar12 >> 1);
              local_68 = local_68 + 1;
            }
            local_58[local_68] = local_58[local_68] + 1;
            iVar5 = p->nObjs;
          }
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar9 + 0xc;
        iVar8 = iVar8 + 2;
      } while (lVar13 < iVar5);
    }
  }
  Gia_ManHashStop(p);
  if (fVerbose != 0) {
    iVar5 = p_00->nSize;
    printf("Found %d half-adders with XOR gates: ",(ulong)(uint)(iVar5 / 2));
    uVar14 = 0;
    do {
      printf("%d=%d ",uVar14 & 0xffffffff,(ulong)local_58[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar14 != 5);
    putchar(10);
    if (1 < iVar5) {
      piVar6 = p_00->pArray;
      uVar14 = 0;
      do {
        iVar8 = piVar6[uVar14];
        lVar9 = (long)iVar8;
        if ((lVar9 < 0) || (p->nObjs <= iVar8)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        printf("%3d : %5d %5d -> %5d %5d\n",uVar14 & 0xffffffff,
               (ulong)(iVar8 - ((uint)*(undefined8 *)(p->pObjs + lVar9) & 0x1fffffff)),
               (ulong)(iVar8 - ((uint)((ulong)*(undefined8 *)(p->pObjs + lVar9) >> 0x20) &
                               0x1fffffff)),lVar9,(ulong)(uint)piVar6[uVar14 + 1]);
        iVar8 = (int)uVar14;
        uVar14 = uVar14 + 2;
      } while (iVar8 + 3 < iVar5);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManDetectHalfAdders( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vHadds = Vec_IntAlloc( 1000 );
    Gia_Obj_t * pObj, * pFan0, * pFan1; 
    int i, iLit, iFan0, iFan1, fComplDiff, Count, Counts[5] = {0};
    Gia_ManHashStart( p );
    if ( p->nXors )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsXor(pObj) )
                continue;
            Count = 0;
            iFan0 = Gia_ObjFaninId0(pObj, i);
            iFan1 = Gia_ObjFaninId1(pObj, i);
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            Counts[Count]++;
        }
    }
    else
    {
        ABC_FREE( p->pRefs );
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
                continue;
            Count = 0;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId0(pObj, i) ), Count++;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId1(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId1(pObj, i) ), Count++;
            iFan0 = Gia_ObjId( p, pFan0 );
            iFan1 = Gia_ObjId( p, pFan1 );
            fComplDiff =          (Gia_ObjFaninC0(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin0(pObj)));
            assert( fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj))) );
            if ( fComplDiff )
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            else
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            Counts[Count]++;
        }
        ABC_FREE( p->pRefs );
    }
    Gia_ManHashStop( p );
    if ( fVerbose )
    {
        int iXor, iAnd;
        printf( "Found %d half-adders with XOR gates: ", Vec_IntSize(vHadds)/2 );
        for ( i = 0; i <= 4; i++ )
            printf( "%d=%d ", i, Counts[i] );
        printf( "\n" );

        Vec_IntForEachEntryDouble( vHadds, iXor, iAnd, i )
        {
            pObj = Gia_ManObj( p, iXor );
            printf( "%3d : %5d %5d -> %5d %5d\n", i, Gia_ObjFaninId0(pObj, iXor), Gia_ObjFaninId1(pObj, iXor), iXor, iAnd );
        }
    }
    return vHadds;
}